

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_service_interface(t_dart_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  ostream *poVar1;
  t_dart_generator *this_00;
  pointer pptVar2;
  string class_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_iface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  string local_128;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_108;
  string local_f0 [32];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string(local_f0,"",(allocator *)&bStack_148);
  if (tservice->extends_ != (t_service *)0x0) {
    get_ttype_class_name_abi_cxx11_(&local_128,this,&tservice->extends_->super_t_type);
    std::operator+(&bStack_148," extends ",&local_128);
    std::__cxx11::string::operator=(local_f0,(string *)&bStack_148);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::__cxx11::string::~string((string *)&local_128);
  }
  out = &this->f_service_;
  generate_dart_doc(this,(ostream *)out,(t_doc *)tservice);
  this_00 = (t_dart_generator *)&(this->super_t_oop_generator).super_t_generator.service_name_;
  std::__cxx11::string::string((string *)&bStack_148,(string *)this_00);
  std::__cxx11::string::string((string *)&local_70,(string *)this_00);
  get_file_name(&local_50,this_00,&local_70);
  std::__cxx11::string::string((string *)&local_90,(string *)&bStack_148);
  export_class_to_library(this,&local_50,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar1 = t_generator::indent((t_generator *)this,(ostream *)out);
  poVar1 = std::operator<<(poVar1,"abstract class ");
  poVar1 = std::operator<<(poVar1,(string *)&bStack_148);
  std::operator<<(poVar1,local_f0);
  std::__cxx11::string::string((string *)&local_b0," ",(allocator *)&local_128);
  scope_up(this,(ostream *)out,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_108,&tservice->functions_
            );
  for (pptVar2 = local_108._M_impl.super__Vector_impl_data._M_start;
      pptVar2 != local_108._M_impl.super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    generate_dart_doc(this,(ostream *)out,*pptVar2);
    poVar1 = t_generator::indent((t_generator *)this,(ostream *)out);
    function_signature_abi_cxx11_(&local_128,this,*pptVar2);
    poVar1 = std::operator<<(poVar1,(string *)&local_128);
    poVar1 = std::operator<<(poVar1,";");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::__cxx11::string::string((string *)&local_d0,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)out,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_108);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::__cxx11::string::~string(local_f0);
  return;
}

Assistant:

void t_dart_generator::generate_service_interface(t_service* tservice) {
  string extends_iface = "";
  if (tservice->get_extends() != nullptr) {
    extends_iface = " extends " + get_ttype_class_name(tservice->get_extends());
  }

  generate_dart_doc(f_service_, tservice);

  string class_name = service_name_;
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "abstract class " << class_name << extends_iface;
  scope_up(f_service_);

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << endl;
    generate_dart_doc(f_service_, *f_iter);
    indent(f_service_) << function_signature(*f_iter) << ";" << endl;
  }

  scope_down(f_service_, endl2);
}